

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

void __thiscall RoboClaw::clear(RoboClaw *this)

{
  int __fd;
  undefined1 local_1d;
  int local_1c;
  
  if (this->m_serial != 0) {
    local_1c = 0;
    ioctl(this->m_serial,0x541b,&local_1c);
    if (local_1c != 0) {
      do {
        local_1d = 0;
        __fd = 0;
        if (this->m_serial != 0) {
          ::read(this->m_serial,&local_1d,1);
          __fd = this->m_serial;
        }
        local_1c = 0;
        ioctl(__fd,0x541b,&local_1c);
      } while (local_1c != 0);
    }
  }
  return;
}

Assistant:

void RoboClaw::clear()
{
    // read everything on serial port.
    if( m_serial )
    {
        while( available() )
        {
            read();
        }
    }
}